

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

BlockStatementPtr __thiscall VMState::PushBlock(VMState *this)

{
  BlockStatement *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  BlockStatementPtr BVar1;
  __shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  __p = (BlockStatement *)operator_new(0x30);
  (__p->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->super_Statement)._vptr_Statement = (_func_int **)&PTR_GetType_00129cc0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BlockStatement,void>
            ((__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8),&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (BlockStatementPtr)BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BlockStatementPtr PushBlock( void )
	{
		BlockStatementPtr prevBlock = m_Block;
		m_Block = BlockStatementPtr(new BlockStatement);

		return prevBlock;
	}